

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

size_t __thiscall AddrManImpl::Size_(AddrManImpl *this,optional<Network> net,optional<bool> in_new)

{
  const_iterator cVar1;
  size_t sVar2;
  int *piVar3;
  long in_FS_OFFSET;
  _Optional_payload_base<Network> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (_Optional_payload_base<Network>)
             net.super__Optional_base<Network,_true,_true>._M_payload.
             super__Optional_payload_base<Network>;
  if (((ulong)net.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
    if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> >> 8 & 1) == 0) {
      sVar2 = (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
    }
    else {
      piVar3 = &this->nNew;
      if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) == 0) {
        piVar3 = &this->nTried;
      }
      sVar2 = (long)*piVar3;
    }
  }
  else {
    cVar1 = std::
            _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_network_counts)._M_h,(key_type *)&local_20);
    if (cVar1.super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
        ._M_cur == (__node_type *)0x0) {
      sVar2 = 0;
    }
    else if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> >> 8 & 1) == 0) {
      sVar2 = *(size_t *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                      ._M_cur + 0x18) +
              *(size_t *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                      ._M_cur + 0x10);
    }
    else {
      sVar2 = *(size_t *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                      ._M_cur + 0x18);
      if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) != 0) {
        sVar2 = *(size_t *)
                 ((long)cVar1.
                        super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                        ._M_cur + 0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return sVar2;
}

Assistant:

size_t AddrManImpl::Size_(std::optional<Network> net, std::optional<bool> in_new) const
{
    AssertLockHeld(cs);

    if (!net.has_value()) {
        if (in_new.has_value()) {
            return *in_new ? nNew : nTried;
        } else {
            return vRandom.size();
        }
    }
    if (auto it = m_network_counts.find(*net); it != m_network_counts.end()) {
        auto net_count = it->second;
        if (in_new.has_value()) {
            return *in_new ? net_count.n_new : net_count.n_tried;
        } else {
            return net_count.n_new + net_count.n_tried;
        }
    }
    return 0;
}